

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

void setCompDefaults(jpeg_compress_struct *cinfo,int pixelFormat,int subsamp,int jpegQual,int flags)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  j_compress_ptr cinfo_00;
  J_COLOR_SPACE in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  uint in_R8D;
  char tempc;
  int temp;
  char *env;
  uint in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  *(J_COLOR_SPACE *)(in_RDI + 0x3c) = pf2cs[in_ESI];
  *(int *)(in_RDI + 0x38) = tjPixelSize[in_ESI];
  jpeg_set_defaults((j_compress_ptr)0x0);
  pcVar2 = getenv("TJ_OPTIMIZE");
  if (((pcVar2 != (char *)0x0) && (sVar3 = strlen(pcVar2), sVar3 != 0)) &&
     (iVar1 = strcmp(pcVar2,"1"), iVar1 == 0)) {
    *(undefined4 *)(in_RDI + 0x108) = 1;
  }
  pcVar2 = getenv("TJ_ARITHMETIC");
  if (((pcVar2 != (char *)0x0) && (sVar3 = strlen(pcVar2), sVar3 != 0)) &&
     (iVar1 = strcmp(pcVar2,"1"), iVar1 == 0)) {
    *(undefined4 *)(in_RDI + 0x104) = 1;
  }
  cinfo_00 = (j_compress_ptr)getenv("TJ_RESTART");
  if ((cinfo_00 != (j_compress_ptr)0x0) && (sVar3 = strlen((char *)cinfo_00), sVar3 != 0)) {
    in_stack_ffffffffffffffdc = -1;
    in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffd8 & 0xffffff;
    iVar1 = __isoc99_sscanf(cinfo_00,"%d%c",&stack0xffffffffffffffdc,&stack0xffffffffffffffdb);
    if ((0 < iVar1) && ((-1 < in_stack_ffffffffffffffdc && (in_stack_ffffffffffffffdc < 0x10000))))
    {
      iVar1 = toupper((int)(char)(in_stack_ffffffffffffffd8 >> 0x18));
      if (iVar1 == 0x42) {
        *(int *)(in_RDI + 0x118) = in_stack_ffffffffffffffdc;
        *(undefined4 *)(in_RDI + 0x11c) = 0;
      }
      else {
        *(int *)(in_RDI + 0x11c) = in_stack_ffffffffffffffdc;
      }
    }
  }
  if (-1 < (int)in_ECX) {
    jpeg_set_quality(cinfo_00,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
    if (((int)in_ECX < 0x60) && ((in_R8D & 0x1000) == 0)) {
      *(undefined4 *)(in_RDI + 0x114) = 1;
    }
    else {
      *(undefined4 *)(in_RDI + 0x114) = 0;
    }
  }
  if (in_EDX == 3) {
    jpeg_set_colorspace((j_compress_ptr)CONCAT44(in_ESI,3),in_ECX);
  }
  else if (in_ESI == 0xb) {
    jpeg_set_colorspace((j_compress_ptr)CONCAT44(0xb,in_EDX),in_ECX);
  }
  else {
    jpeg_set_colorspace((j_compress_ptr)CONCAT44(in_ESI,in_EDX),in_ECX);
  }
  if ((in_R8D & 0x4000) == 0) {
    pcVar2 = getenv("TJ_PROGRESSIVE");
    if (((pcVar2 != (char *)0x0) && (sVar3 = strlen(pcVar2), sVar3 != 0)) &&
       (iVar1 = strcmp(pcVar2,"1"), iVar1 == 0)) {
      jpeg_simple_progression((j_compress_ptr)CONCAT44(in_ESI,in_EDX));
    }
  }
  else {
    jpeg_simple_progression((j_compress_ptr)CONCAT44(in_ESI,in_EDX));
  }
  *(int *)(*(long *)(in_RDI + 0x58) + 8) = tjMCUWidth[in_EDX] / 8;
  *(undefined4 *)(*(long *)(in_RDI + 0x58) + 0x68) = 1;
  *(undefined4 *)(*(long *)(in_RDI + 0x58) + 200) = 1;
  if (3 < *(int *)(in_RDI + 0x4c)) {
    *(int *)(*(long *)(in_RDI + 0x58) + 0x128) = tjMCUWidth[in_EDX] / 8;
  }
  *(int *)(*(long *)(in_RDI + 0x58) + 0xc) = tjMCUHeight[in_EDX] / 8;
  *(undefined4 *)(*(long *)(in_RDI + 0x58) + 0x6c) = 1;
  *(undefined4 *)(*(long *)(in_RDI + 0x58) + 0xcc) = 1;
  if (3 < *(int *)(in_RDI + 0x4c)) {
    *(int *)(*(long *)(in_RDI + 0x58) + 300) = tjMCUHeight[in_EDX] / 8;
  }
  return;
}

Assistant:

static void setCompDefaults(struct jpeg_compress_struct *cinfo,
                            int pixelFormat, int subsamp, int jpegQual,
                            int flags)
{
#ifndef NO_GETENV
  char *env = NULL;
#endif

  cinfo->in_color_space = pf2cs[pixelFormat];
  cinfo->input_components = tjPixelSize[pixelFormat];
  jpeg_set_defaults(cinfo);

#ifndef NO_GETENV
  if ((env = getenv("TJ_OPTIMIZE")) != NULL && strlen(env) > 0 &&
      !strcmp(env, "1"))
    cinfo->optimize_coding = TRUE;
  if ((env = getenv("TJ_ARITHMETIC")) != NULL && strlen(env) > 0 &&
      !strcmp(env, "1"))
    cinfo->arith_code = TRUE;
  if ((env = getenv("TJ_RESTART")) != NULL && strlen(env) > 0) {
    int temp = -1;
    char tempc = 0;

    if (sscanf(env, "%d%c", &temp, &tempc) >= 1 && temp >= 0 &&
        temp <= 65535) {
      if (toupper(tempc) == 'B') {
        cinfo->restart_interval = temp;
        cinfo->restart_in_rows = 0;
      } else
        cinfo->restart_in_rows = temp;
    }
  }
#endif

  if (jpegQual >= 0) {
    jpeg_set_quality(cinfo, jpegQual, TRUE);
    if (jpegQual >= 96 || flags & TJFLAG_ACCURATEDCT)
      cinfo->dct_method = JDCT_ISLOW;
    else
      cinfo->dct_method = JDCT_FASTEST;
  }
  if (subsamp == TJSAMP_GRAY)
    jpeg_set_colorspace(cinfo, JCS_GRAYSCALE);
  else if (pixelFormat == TJPF_CMYK)
    jpeg_set_colorspace(cinfo, JCS_YCCK);
  else
    jpeg_set_colorspace(cinfo, JCS_YCbCr);

  if (flags & TJFLAG_PROGRESSIVE)
    jpeg_simple_progression(cinfo);
#ifndef NO_GETENV
  else if ((env = getenv("TJ_PROGRESSIVE")) != NULL && strlen(env) > 0 &&
           !strcmp(env, "1"))
    jpeg_simple_progression(cinfo);
#endif

  cinfo->comp_info[0].h_samp_factor = tjMCUWidth[subsamp] / 8;
  cinfo->comp_info[1].h_samp_factor = 1;
  cinfo->comp_info[2].h_samp_factor = 1;
  if (cinfo->num_components > 3)
    cinfo->comp_info[3].h_samp_factor = tjMCUWidth[subsamp] / 8;
  cinfo->comp_info[0].v_samp_factor = tjMCUHeight[subsamp] / 8;
  cinfo->comp_info[1].v_samp_factor = 1;
  cinfo->comp_info[2].v_samp_factor = 1;
  if (cinfo->num_components > 3)
    cinfo->comp_info[3].v_samp_factor = tjMCUHeight[subsamp] / 8;
}